

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O3

_Bool gravity_vm_runclosure
                (gravity_vm *vm,gravity_closure_t *closure,gravity_value_t sender,
                gravity_value_t *params,uint16_t nparams)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ushort uVar4;
  ushort uVar5;
  gravity_exec_type gVar6;
  gravity_function_t *pgVar7;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  gravity_function_t *pgVar9;
  undefined8 uVar10;
  _Bool _Var11;
  uint32_t uVar12;
  uint uVar13;
  gravity_value_t *pgVar14;
  long lVar15;
  gravity_callframe_t *pgVar16;
  gravity_list_t *pgVar17;
  uint uVar18;
  gravity_upvalue_t *pgVar19;
  uint uVar20;
  gravity_class_t *pgVar21;
  gravity_value_t *pgVar22;
  error_type_t error_type;
  ulong uVar23;
  gravity_value_t *pgVar24;
  long lVar25;
  gravity_callframe_t *pgVar26;
  uint32_t uVar27;
  ulong uVar28;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar29;
  gravity_value_t *pgVar30;
  gravity_value_t gVar31;
  uint32_t *local_48;
  gravity_callframe_t *ptr;
  
  pgVar21 = sender.isa;
  if (closure == (gravity_closure_t *)0x0 || vm == (gravity_vm *)0x0) {
    return false;
  }
  if (vm->aborted != false) {
    return false;
  }
  pgVar7 = closure->f;
  if ((pgVar7 != (gravity_function_t *)0x0) && (pgVar7->tag == EXEC_TYPE_NATIVE)) {
    if ((pgVar7->field_9).field_0.bytecode == (uint32_t *)0x0) {
      return true;
    }
    if ((pgVar7->field_9).field_0.ninsts == 0) {
      return true;
    }
  }
  fiber = vm->fiber;
  aVar8 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)closure->context;
  aVar29.n = sender.field_1.n;
  if ((gravity_object_t *)aVar8.n != (gravity_object_t *)0x0) {
    pgVar21 = (aVar8.p)->isa;
    aVar29 = aVar8;
  }
  if (fiber->nframes == 0) {
    uVar20 = nparams + 1;
    gravity_fiber_reassign(fiber,closure,(uint16_t)uVar20);
    pgVar9 = closure->f;
    uVar13 = (uint)pgVar9->nparams;
    if (pgVar9->nparams < uVar20) {
      uVar13 = uVar20;
    }
    pgVar22 = vm->fiber->stack;
    uVar4 = pgVar9->nlocals;
    uVar5 = pgVar9->ntemps;
    pgVar22->isa = pgVar21;
    (pgVar22->field_1).n = (gravity_int_t)aVar29;
    if (nparams != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&params->isa + lVar15);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pgVar22[1].isa + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        lVar15 = lVar15 + 0x10;
      } while ((ulong)nparams << 4 != lVar15);
    }
    pgVar26 = fiber->frames;
    local_48 = pgVar26->ip;
    if ((closure->f->tag == EXEC_TYPE_NATIVE) && ((closure->f->field_9).field_0.useargs == true)) {
      pgVar17 = gravity_list_from_array(vm,(uint)nparams,pgVar22 + 1);
    }
    else {
      pgVar17 = (gravity_list_t *)0x0;
    }
    uVar28 = (ulong)(uVar13 + (uint)uVar4 + (uint)uVar5);
    pgVar26->args = pgVar17;
    uVar27 = 0;
    goto LAB_00132ebb;
  }
  pgVar16 = fiber->frames;
  uVar18 = fiber->nframes - 1;
  pgVar26 = pgVar16 + uVar18;
  pgVar22 = pgVar16[uVar18].stackstart;
  pgVar9 = (pgVar16[uVar18].closure)->f;
  uVar13._0_2_ = pgVar9->nparams;
  uVar13._2_2_ = pgVar9->nlocals;
  uVar20 = *(uint *)&pgVar16[uVar18].nargs;
  if ((ushort)*(uint *)&pgVar16[uVar18].nargs < (ushort)(undefined2)uVar13) {
    uVar20 = uVar13;
  }
  local_48 = pgVar16[uVar18].ip;
  uVar27 = (uint)pgVar9->ntemps + (uint)pgVar9->nlocals + (uVar20 & 0xffff);
  uVar20 = nparams + 1;
  uVar13 = (uint)pgVar7->nparams;
  if (pgVar7->nparams < uVar20) {
    uVar13 = uVar20;
  }
  uVar23 = (long)((long)pgVar22 +
                 (((ulong)(uVar27 * 0x10) +
                  (ulong)((uint)pgVar7->ntemps + (uint)pgVar7->nlocals + uVar13) * 0x10) -
                 (long)fiber->stacktop)) >> 4;
  uVar28 = 0;
  if (0 < (long)uVar23) {
    uVar28 = uVar23;
  }
  if ((int)uVar28 != 0) {
    pgVar24 = fiber->stacktop + (uVar28 & 0xffffffff);
    fiber->stacktop = pgVar24;
    pgVar30 = fiber->stack;
    uVar18 = (uint)((ulong)((long)pgVar24 - (long)pgVar30) >> 4);
    uVar13 = 0x100;
    if (0x100 < uVar18) {
      uVar13 = uVar18;
    }
    if (fiber->stackalloc < uVar13) {
      uVar12 = power_of2_ceil(fiber->stackalloc + uVar13);
      error_type = (error_type_t)uVar23;
      if ((uVar12 != 0) && (uVar13 + fiber->stackalloc <= uVar12)) {
        pgVar24 = fiber->stack;
        pgVar14 = (gravity_value_t *)gravity_realloc((gravity_vm *)0x0,pgVar24,(ulong)uVar12 << 4);
        error_type = (error_type_t)pgVar24;
        if (pgVar14 != (gravity_value_t *)0x0) {
          fiber->stack = pgVar14;
          fiber->stackalloc = uVar12;
          lVar15 = (long)pgVar14 - (long)pgVar30;
          if (lVar15 != 0) {
            uVar13 = fiber->nframes;
            if ((ulong)uVar13 != 0) {
              pgVar16 = fiber->frames;
              lVar25 = 0;
              do {
                plVar3 = (long *)((long)&pgVar16->stackstart + lVar25);
                *plVar3 = *plVar3 + lVar15;
                lVar25 = lVar25 + 0x30;
              } while ((ulong)uVar13 * 0x30 != lVar25);
            }
            for (pgVar19 = fiber->upvalues; pgVar19 != (gravity_upvalue_t *)0x0;
                pgVar19 = pgVar19->next) {
              pgVar19->value = (gravity_value_t *)((long)pgVar19->value + lVar15);
            }
            fiber->stacktop = (gravity_value_t *)((long)fiber->stacktop + lVar15);
            pgVar22 = (gravity_value_t *)((long)pgVar22 + lVar15);
          }
          goto LAB_00132d44;
        }
      }
      fiber->stacktop = fiber->stacktop + -(uVar28 & 0xffffffff);
      pgVar26->ip = local_48;
      goto LAB_00132fdc;
    }
  }
LAB_00132d44:
  uVar23 = (ulong)(uVar27 * 0x10);
  *(gravity_class_t **)((long)&pgVar22->isa + uVar23) = pgVar21;
  ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar22->field_1 + uVar23))->n =
       (gravity_int_t)aVar29;
  if (nparams != 0) {
    lVar15 = 0;
    do {
      puVar1 = (undefined8 *)((long)&params->isa + lVar15);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pgVar22[1].isa + lVar15 + (ulong)(uVar27 * 0x10));
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)nparams << 4 != lVar15);
  }
  pgVar26->ip = local_48;
  uVar13 = fiber->nframes;
  if (fiber->framesalloc == uVar13) {
    uVar13 = fiber->framesalloc * 2;
    ptr = fiber->frames;
    pgVar16 = (gravity_callframe_t *)gravity_realloc((gravity_vm *)0x0,ptr,(ulong)uVar13 * 0x30);
    error_type = (error_type_t)ptr;
    if (pgVar16 == (gravity_callframe_t *)0x0) {
LAB_00132fdc:
      report_runtime_error
                (vm,error_type,"Infinite loop detected. Current execution must be aborted.");
      return false;
    }
    fiber->frames = pgVar16;
    fiber->framesalloc = uVar13;
    uVar13 = fiber->nframes;
    fiber->nframes = uVar13 + 1;
    pgVar16 = pgVar16 + uVar13;
  }
  else {
    fiber->nframes = uVar13 + 1;
    if (fiber->frames == (gravity_callframe_t *)0x0) {
      return false;
    }
    pgVar16 = fiber->frames + uVar13;
  }
  pgVar30 = (gravity_value_t *)((long)&pgVar22->isa + uVar23);
  pgVar16->closure = closure;
  pgVar16->stackstart = pgVar30;
  pgVar9 = closure->f;
  pgVar16->ip = (pgVar9->field_9).field_0.bytecode;
  pgVar16->dest = uVar27;
  pgVar16->nargs = (uint16_t)uVar20;
  pgVar16->outloop = false;
  if ((pgVar9->tag == EXEC_TYPE_NATIVE) && ((pgVar9->field_9).field_0.useargs == true)) {
    pgVar17 = gravity_list_from_array(vm,(uint)nparams,pgVar30 + 1);
  }
  else {
    pgVar17 = (gravity_list_t *)0x0;
  }
  pgVar16->args = pgVar17;
  pgVar16->outloop = true;
LAB_00132ebb:
  gVar6 = pgVar7->tag;
  if (gVar6 == EXEC_TYPE_BRIDGED) {
    if (vm->delegate->bridge_execute == (gravity_bridge_execute)0x0) {
      _Var11 = false;
    }
    else {
      gravity_gc_setenabled(vm,false);
      gVar31.field_1.n = aVar29.n;
      gVar31.isa = pgVar21;
      _Var11 = (*vm->delegate->bridge_execute)
                         (vm,pgVar7->xdata,gVar31,
                          (gravity_value_t *)((long)&pgVar22->isa + (ulong)(uVar27 << 4)),nparams,
                          0xfffffffe);
      gravity_gc_setenabled(vm,true);
    }
  }
  else if (gVar6 == EXEC_TYPE_INTERNAL) {
    gravity_gc_setenabled(vm,false);
    _Var11 = (*(pgVar7->field_9).internal)
                       (vm,(gravity_value_t *)((long)&pgVar22->isa + (ulong)(uVar27 << 4)),nparams,
                        0xfffffffe);
    gravity_gc_setenabled(vm,true);
  }
  else if (gVar6 == EXEC_TYPE_NATIVE) {
    uVar13 = vm->nccalls + 1;
    vm->nccalls = uVar13;
    if (vm->maxccalls < uVar13) {
      pgVar26->ip = local_48;
      report_runtime_error
                (vm,(error_type_t)pgVar26,"Maximum number of nested C calls reached (%d).");
      return false;
    }
    _Var11 = gravity_vm_exec(vm);
    vm->nccalls = vm->nccalls - 1;
  }
  else {
    _Var11 = false;
  }
  if (fiber == vm->fiber) {
    if (pgVar7->tag != EXEC_TYPE_NATIVE) {
      fiber->nframes = fiber->nframes - 1;
    }
    fiber->stacktop = fiber->stacktop + -(uVar28 & 0xffffffff);
  }
  return _Var11;
}

Assistant:

bool gravity_vm_runclosure (gravity_vm *vm, gravity_closure_t *closure, gravity_value_t sender, gravity_value_t params[], uint16_t nparams) {
    if (!vm || !closure || vm->aborted) return false;

    // do not waste cycles on empty functions
    gravity_function_t *f = closure->f;
    if (f && (f->tag == EXEC_TYPE_NATIVE) && ((!f->bytecode) || (f->ninsts == 0))) return true;

    // current execution fiber
    gravity_fiber_t     *fiber = vm->fiber;
    gravity_value_t     *stackstart = NULL;
    uint32_t            rwin = 0;
	uint32_t			stacktopdelta = 0;
    
    // current frame and current instruction pointer
    gravity_callframe_t *frame;
    uint32_t            *ip;
	
    DEBUG_STACK();

    // self value is default to the context where the closure has been created (or set by the user)
    gravity_value_t selfvalue;

    // MSVC bug: designated initializer was prematurely evaluated
    if (closure->context) selfvalue = VALUE_FROM_OBJECT(closure->context);
    else selfvalue = sender;
    
    // we need a way to give user the ability to access the sender value from a closure
    
    // if fiber->nframes is not zero it means that this event has been recursively called
    // from somewhere inside the main function so we need to protect and correctly setup
    // the new activation frame
    if (fiber->nframes) {
        // current call frame
        frame = &fiber->frames[fiber->nframes - 1];

        // current top of the stack
        stackstart = frame->stackstart;

        // current instruction pointer
        ip = frame->ip;

        // compute register window
        rwin = FN_COUNTREG(frame->closure->f, frame->nargs);

        // check stack size
        uint32_t _rneed = FN_COUNTREG(f,nparams+1);
		stacktopdelta = (uint32_t)MAXNUM(stackstart + rwin + _rneed - vm->fiber->stacktop, 0);
        if (!gravity_check_stack(vm, vm->fiber, stacktopdelta, &stackstart)) {
            RUNTIME_ERROR("Infinite loop detected. Current execution must be aborted.");
        }
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        STORE_FRAME();
        PUSH_FRAME(closure, &stackstart[rwin], rwin, nparams+1);
        SETFRAME_OUTLOOP(cframe);
    } else {
        // there are no execution frames when called outside main function
        gravity_fiber_reassign(vm->fiber, closure, nparams+1);
        stackstart = vm->fiber->stack;
		stacktopdelta = FN_COUNTREG(closure->f, nparams+1);
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        // check if closure uses the special _args instruction
        frame = &fiber->frames[0];
        ip = frame->ip;
        frame->args = (USE_ARGS(closure)) ? gravity_list_from_array(vm, nparams, &stackstart[rwin]+1) : NULL;
    }

    // f can be native, internal or bridge because this function
    // is called also by convert_value2string
    // for example in Creo:
    // var mData = Data();
    // Console.write("data: " + mData);
    // mData.String is a bridged objc method
    DEBUG_STACK();

    bool result = false;
    switch (f->tag) {
        case EXEC_TYPE_NATIVE:
            ++vm->nccalls;
            if (vm->nccalls > vm->maxccalls) RUNTIME_ERROR("Maximum number of nested C calls reached (%d).", vm->maxccalls);
            result = gravity_vm_exec(vm);
            --vm->nccalls;
            break;

        case EXEC_TYPE_INTERNAL:
            BEGIN_TRUST_USERCODE(vm);
            result = f->internal(vm, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
            END_TRUST_USERCODE(vm);
            break;

        case EXEC_TYPE_BRIDGED:
            if (vm->delegate->bridge_execute) {
                BEGIN_TRUST_USERCODE(vm);
                result = vm->delegate->bridge_execute(vm, f->xdata, selfvalue, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
                END_TRUST_USERCODE(vm);
            }
            break;

        case EXEC_TYPE_SPECIAL:
            result = false;
            break;
    }
    
    if (fiber == vm->fiber) {
        // fix pointers ONLY if fiber remains the same
        if (f->tag != EXEC_TYPE_NATIVE) --fiber->nframes;
        fiber->stacktop -= stacktopdelta;
    }
	
    DEBUG_STACK();
    return result;
}